

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  char *pcVar8;
  string *psVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  ostream *poVar13;
  CURL_conflict *data;
  curl_slist *list;
  long *plVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  size_type *psVar16;
  string *h;
  value_type *val;
  pointer pbVar17;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string expectedHash;
  string err_2;
  string actualHash_1;
  cURLProgressHelper helper;
  string file;
  string dir;
  string statusVar;
  ofstream fout;
  cmFileCommandVectorOfChar chunkDebug;
  string status;
  string netrc_level;
  string hashMatchMSG;
  string logVar;
  string userpwd;
  string netrc_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string url;
  bool local_639;
  _Head_base<0UL,_cmCryptoHash_*,_false> local_638;
  long local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  undefined1 local_608 [8];
  char *local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8 [6];
  ios_base local_598 [264];
  ulong local_490;
  string local_488;
  undefined1 local_468 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  string local_438;
  string local_418;
  string local_3f8;
  undefined1 local_3d8 [8];
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  byte abStack_3b8 [80];
  ios_base local_368 [136];
  ios_base local_2e0 [264];
  vector<char,_std::allocator<char>_> local_1d8;
  char *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  string local_158;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  cmCryptoHash *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_3d8 = (undefined1  [8])&local_3c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3d8,"DOWNLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
    if (local_3d8 != (undefined1  [8])&local_3c8) {
      operator_delete((void *)local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    return false;
  }
  local_d8[0] = local_c8;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8._M_string_length = 0;
  local_3f8.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3d8 = (undefined1  [8])&local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"CMAKE_TLS_VERIFY","");
  local_639 = cmMakefile::IsOn(pcVar3,(string *)local_3d8);
  if (local_3d8 != (undefined1  [8])&local_3c8) {
    operator_delete((void *)local_3d8,local_3c8._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3d8 = (undefined1  [8])&local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"CMAKE_TLS_CAINFO","");
  pcVar8 = cmMakefile::GetDefinition(pcVar3,(string *)local_3d8);
  if (local_3d8 != (undefined1  [8])&local_3c8) {
    operator_delete((void *)local_3d8,local_3c8._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3d8 = (undefined1  [8])&local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"CMAKE_NETRC","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_3d8);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar2 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar2,pcVar2 + psVar9->_M_string_length);
  if (local_3d8 != (undefined1  [8])&local_3c8) {
    operator_delete((void *)local_3d8,local_3c8._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3d8 = (undefined1  [8])&local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"CMAKE_NETRC_FILE","");
  psVar9 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_3d8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar2 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + psVar9->_M_string_length);
  val = pbVar1 + 3;
  local_1c0 = pcVar8;
  if (local_3d8 != (undefined1  [8])&local_3c8) {
    operator_delete((void *)local_3d8,local_3c8._M_allocated_capacity + 1);
  }
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  lVar11 = 0;
  local_628._M_string_length = 0;
  local_628.field_2._M_local_buf[0] = '\0';
  local_178 = &local_168;
  local_170 = 0;
  local_168 = 0;
  local_638._M_head_impl = (cmCryptoHash *)0x0;
  local_138 = &local_128;
  local_130 = 0;
  local_128 = 0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (val == (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    local_490 = 0;
    local_630 = 0;
  }
  else {
    local_630 = 0;
    lVar11 = 0;
    local_490 = 0;
    do {
      iVar6 = std::__cxx11::string::compare((char *)val);
      if (iVar6 == 0) {
        val = val + 1;
        if (val == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
          local_3d8 = (undefined1  [8])&local_3c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3d8,"DOWNLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
          goto LAB_00231df3;
        }
        local_630 = atol((val->_M_dataplus)._M_p);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)val);
        if (iVar6 == 0) {
          val = val + 1;
          if (val == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
            local_3d8 = (undefined1  [8])&local_3c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3d8,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
            goto LAB_00231df3;
          }
          lVar11 = atol((val->_M_dataplus)._M_p);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)val);
          if (iVar6 == 0) {
            val = val + 1;
            if (val == (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
              local_3d8 = (undefined1  [8])&local_3c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3d8,"DOWNLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
              goto LAB_00231df3;
            }
            std::__cxx11::string::_M_assign((string *)&local_158);
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)val);
            if (iVar6 == 0) {
              val = val + 1;
              if (val == (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
                local_3d8 = (undefined1  [8])&local_3c8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3d8,"DOWNLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                goto LAB_00231df3;
              }
              std::__cxx11::string::_M_assign((string *)&local_3f8);
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)val);
              if (iVar6 == 0) {
                val = val + 1;
                if (val == (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish) {
                  local_3d8 = (undefined1  [8])&local_3c8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3d8,"TLS_VERIFY missing bool value.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                  goto LAB_00231df3;
                }
                local_639 = cmSystemTools::IsOn(val);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)val);
                if (iVar6 == 0) {
                  val = val + 1;
                  if (val == (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish) {
                    local_3d8 = (undefined1  [8])&local_3c8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3d8,"TLS_CAFILE missing file value.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                    goto LAB_00231df3;
                  }
                  local_1c0 = (val->_M_dataplus)._M_p;
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)val);
                  if (iVar6 == 0) {
                    val = val + 1;
                    if (val == (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish) {
                      local_3d8 = (undefined1  [8])&local_3c8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3d8,"DOWNLOAD missing file value for NETRC_FILE.",
                                 "");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                      goto LAB_00231df3;
                    }
                    std::__cxx11::string::_M_assign((string *)&local_118);
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)val);
                    if (iVar6 == 0) {
                      val = val + 1;
                      if (val == (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish) {
                        local_3d8 = (undefined1  [8])&local_3c8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_3d8,"DOWNLOAD missing level value for NETRC.","")
                        ;
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                        goto LAB_00231df3;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_198);
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)val);
                      if (iVar6 == 0) {
                        val = val + 1;
                        if (val == (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) {
                          local_3d8 = (undefined1  [8])&local_3c8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_3d8,
                                     "DOWNLOAD missing sum value for EXPECTED_MD5.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                          goto LAB_00231df3;
                        }
                        local_608 = (undefined1  [8])((ulong)local_608 & 0xffffffff00000000);
                        std::make_unique<cmCryptoHash,cmCryptoHash::Algo>((Algo *)local_3d8);
                        auVar4 = local_3d8;
                        local_3d8 = (undefined1  [8])0x0;
                        std::__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                        reset((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                              &local_638,(pointer)auVar4);
                        std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                        ~unique_ptr((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                                    local_3d8);
                        std::__cxx11::string::operator=((string *)&local_178,"MD5 sum");
                        cmsys::SystemTools::LowerCase((string *)local_3d8,val);
                        std::__cxx11::string::operator=((string *)&local_628,(string *)local_3d8);
LAB_0023116e:
                        if (local_3d8 != (undefined1  [8])&local_3c8) {
                          operator_delete((void *)local_3d8,local_3c8._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        uVar10 = std::__cxx11::string::compare((char *)val);
                        if ((int)uVar10 == 0) {
                          local_490 = CONCAT71((int7)((ulong)uVar10 >> 8),1);
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)val);
                          if (iVar6 == 0) {
                            psVar9 = val + 1;
                            if (psVar9 == (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish) {
                              local_3d8 = (undefined1  [8])&local_3c8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3d8,
                                         "DOWNLOAD missing ALGO=value for EXPECTED_HASH.","");
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
LAB_00231df3:
                              if (local_3d8 != (undefined1  [8])&local_3c8) {
                                operator_delete((void *)local_3d8,
                                                local_3c8._M_allocated_capacity + 1);
                              }
                            }
                            else {
                              lVar12 = std::__cxx11::string::find((char *)psVar9,0x4b9f40,0);
                              if (lVar12 == -1) {
                                local_3d8 = (undefined1  [8])&local_3c8;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_3d8,
                                           "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ","")
                                ;
                                std::__cxx11::string::_M_append
                                          (local_3d8,(ulong)val[1]._M_dataplus._M_p);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                                goto LAB_00231df3;
                              }
                              std::__cxx11::string::substr((ulong)local_3d8,(ulong)psVar9);
                              std::__cxx11::string::substr((ulong)local_468,(ulong)psVar9);
                              cmsys::SystemTools::LowerCase((string *)local_608,(string *)local_468)
                              ;
                              std::__cxx11::string::operator=
                                        ((string *)&local_628,(string *)local_608);
                              if (local_608 != (undefined1  [8])local_5f8) {
                                operator_delete((void *)local_608,
                                                CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                                         local_5f8[0]._M_local_buf[0]) + 1);
                              }
                              if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
                                operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
                              }
                              cmCryptoHash::New((cmCryptoHash *)local_608,(char *)local_3d8);
                              auVar4 = local_608;
                              local_608 = (undefined1  [8])0x0;
                              std::__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                              ::reset((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                       *)&local_638,(pointer)auVar4);
                              std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                              ~unique_ptr((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                           *)local_608);
                              local_b8 = local_638._M_head_impl;
                              if (local_638._M_head_impl == (cmCryptoHash *)0x0) {
                                local_608 = (undefined1  [8])local_5f8;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_608,
                                           "DOWNLOAD EXPECTED_HASH given unknown ALGO: ","");
                                std::__cxx11::string::_M_append(local_608,(ulong)local_3d8);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                              }
                              else {
                                std::operator+((string *)local_608,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_3d8," hash");
                                std::__cxx11::string::operator=
                                          ((string *)&local_178,(string *)local_608);
                              }
                              if (local_608 != (undefined1  [8])local_5f8) {
                                operator_delete((void *)local_608,
                                                CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                                         local_5f8[0]._M_local_buf[0]) + 1);
                              }
                              if (local_3d8 != (undefined1  [8])&local_3c8) {
                                operator_delete((void *)local_3d8,
                                                local_3c8._M_allocated_capacity + 1);
                              }
                              val = psVar9;
                              if (local_b8 != (cmCryptoHash *)0x0) goto LAB_00231007;
                            }
                            bVar5 = false;
                            goto LAB_00231e1a;
                          }
                          iVar6 = std::__cxx11::string::compare((char *)val);
                          if (iVar6 == 0) {
                            if (val + 1 ==
                                (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                              local_3d8 = (undefined1  [8])&local_3c8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3d8,"DOWNLOAD missing string for USERPWD.",
                                         "");
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                              goto LAB_00231df3;
                            }
                            std::__cxx11::string::_M_assign((string *)&local_138);
                            val = val + 1;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare((char *)val);
                            if (iVar6 != 0) {
                              local_3d8 = (undefined1  [8])&local_3c8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3d8,"Unexpected argument: ","");
                              std::__cxx11::string::_M_append
                                        ((char *)local_3d8,(ulong)(val->_M_dataplus)._M_p);
                              cmMakefile::IssueMessage
                                        ((this->super_cmCommand).Makefile,AUTHOR_WARNING,
                                         (string *)local_3d8);
                              goto LAB_0023116e;
                            }
                            val = val + 1;
                            if (val == (args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish) {
                              local_3d8 = (undefined1  [8])&local_3c8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3d8,
                                         "DOWNLOAD missing string for HTTPHEADER.","");
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
                              goto LAB_00231df3;
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_f8,val);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00231007:
      val = val + 1;
    } while (val != (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar5 = cmsys::SystemTools::FileExists(&local_438);
  if ((bVar5) && (local_638._M_head_impl != (cmCryptoHash *)0x0)) {
    local_600 = (char *)0x0;
    local_5f8[0]._M_local_buf[0] = '\0';
    local_608 = (undefined1  [8])local_5f8;
    cmCryptoHash::HashFile((string *)local_468,local_638._M_head_impl,&local_438);
    uVar10 = local_468._0_8_;
    if ((local_468._8_8_ == local_628._M_string_length) &&
       (((cmFileCommand *)local_468._8_8_ == (cmFileCommand *)0x0 ||
        (iVar6 = bcmp((void *)local_468._0_8_,local_628._M_dataplus._M_p,local_468._8_8_),
        iVar6 == 0)))) {
      std::__cxx11::string::_M_replace((ulong)local_608,0,local_600,0x49f43b);
      std::__cxx11::string::_M_append(local_608,(ulong)local_178);
      std::__cxx11::string::append(local_608);
      if (local_3f8._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
        poVar13 = (ostream *)std::ostream::operator<<(local_3d8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\"",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,(char *)local_608,(long)local_600);
        pcVar3 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(pcVar3,&local_3f8,local_418._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
        std::ios_base::~ios_base(local_368);
      }
      if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
        operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
      }
      if (local_608 != (undefined1  [8])local_5f8) {
        operator_delete((void *)local_608,
                        CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                 local_5f8[0]._M_local_buf[0]) + 1);
      }
      bVar5 = true;
      goto LAB_00231e1a;
    }
    if ((undefined1 *)uVar10 != local_468 + 0x10) {
      operator_delete((void *)uVar10,local_468._16_8_ + 1);
    }
    if (local_608 != (undefined1  [8])local_5f8) {
      operator_delete((void *)local_608,
                      CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,local_5f8[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  cmsys::SystemTools::GetFilenamePath(&local_418,&local_438);
  bVar5 = cmsys::SystemTools::FileExists(&local_418);
  if ((bVar5) || (bVar5 = cmsys::SystemTools::MakeDirectory(&local_418,(mode_t *)0x0), bVar5)) {
    std::ofstream::ofstream(local_3d8,local_438._M_dataplus._M_p,_S_bin);
    if ((abStack_3b8[*(long *)((long)local_3d8 + -0x18)] & 5) == 0) {
      curl_global_init(3);
      data = curl_easy_init();
      if (data == (CURL_conflict *)0x0) {
        local_608 = (undefined1  [8])local_5f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_608,"DOWNLOAD error initializing curl.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
        goto LAB_002316d3;
      }
      CVar7 = curl_easy_setopt(data,CURLOPT_URL,local_d8[0]);
      if (CVar7 == CURLE_OK) {
        CVar7 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
        if (CVar7 != CURLE_OK) {
          local_608 = (undefined1  [8])local_5f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_608,"DOWNLOAD cannot set http failure option: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_608);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
          goto LAB_00231bfd;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_USERAGENT,"curl/7.62.0");
        if (CVar7 != CURLE_OK) {
          local_608 = (undefined1  [8])local_5f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_608,"DOWNLOAD cannot set user agent option: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_608);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
          goto LAB_00231bfd;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_7f7ade::cmWriteToFileCallback);
        if (CVar7 != CURLE_OK) {
          local_608 = (undefined1  [8])local_5f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_608,"DOWNLOAD cannot set write function: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_608);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
          goto LAB_00231bfd;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_7f7ade::cmFileCommandCurlDebugCallback);
        if (CVar7 != CURLE_OK) {
          local_608 = (undefined1  [8])local_5f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_608,"DOWNLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_608);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
          goto LAB_00231bfd;
        }
        if (local_639 == false) {
          CVar7 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar7 == CURLE_OK) goto LAB_00231fe3;
          local_608 = (undefined1  [8])local_5f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_608,"Unable to set TLS/SSL Verify off: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_608);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
          goto LAB_00231bfd;
        }
        CVar7 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar7 != CURLE_OK) {
          local_608 = (undefined1  [8])local_5f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_608,"Unable to set TLS/SSL Verify on: ","");
          curl_easy_strerror(CVar7);
          std::__cxx11::string::append(local_608);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
          goto LAB_00231bfd;
        }
LAB_00231fe3:
        cmCurlSetCAInfo_abi_cxx11_(&local_70,data,local_1c0);
        if (local_70._M_string_length == 0) {
          cmsys::SystemTools::UpperCase((string *)local_608,&local_198);
          std::__cxx11::string::operator=((string *)&local_198,(string *)local_608);
          if (local_608 != (undefined1  [8])local_5f8) {
            operator_delete((void *)local_608,
                            CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                     local_5f8[0]._M_local_buf[0]) + 1);
          }
          cmCurlSetNETRCOption(&local_90,data,&local_198,&local_118);
          if (local_90._M_string_length == 0) {
            local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (char *)0x0;
            local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            CVar7 = curl_easy_setopt(data,CURLOPT_WRITEDATA,local_3d8);
            if (CVar7 == CURLE_OK) {
              CVar7 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&local_1d8);
              if (CVar7 != CURLE_OK) {
                local_608 = (undefined1  [8])local_5f8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_608,"DOWNLOAD cannot set debug data: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append(local_608);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                goto LAB_002321cf;
              }
              CVar7 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
              if (CVar7 != CURLE_OK) {
                local_608 = (undefined1  [8])local_5f8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_608,"DOWNLOAD cannot set follow-redirect option: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append(local_608);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                goto LAB_002321cf;
              }
              if ((local_158._M_string_length != 0) &&
                 (CVar7 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar7 != CURLE_OK)) {
                local_608 = (undefined1  [8])local_5f8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_608,"DOWNLOAD cannot set verbose: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append(local_608);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                goto LAB_002321cf;
              }
              if ((0 < local_630) &&
                 (CVar7 = curl_easy_setopt(data,CURLOPT_TIMEOUT,local_630), CVar7 != CURLE_OK)) {
                local_608 = (undefined1  [8])local_5f8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_608,"DOWNLOAD cannot set timeout: ","");
                curl_easy_strerror(CVar7);
                std::__cxx11::string::append(local_608);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                goto LAB_002321cf;
              }
              if (0 < lVar11) {
                curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
                curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,lVar11);
              }
              anon_unknown.dwarf_7f7ade::cURLProgressHelper::cURLProgressHelper
                        ((cURLProgressHelper *)local_468,this,"download");
              if ((local_490 & 1) == 0) {
LAB_00232484:
                if ((local_130 != 0) &&
                   (CVar7 = curl_easy_setopt(data,CURLOPT_USERPWD,local_138), CVar7 != CURLE_OK)) {
                  local_608 = (undefined1  [8])local_5f8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_608,"DOWNLOAD cannot set user password: ","");
                  curl_easy_strerror(CVar7);
                  std::__cxx11::string::append(local_608);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                  goto LAB_002324f1;
                }
                pbVar1 = local_f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                list = (curl_slist *)0x0;
                for (pbVar17 = local_f8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar17 != pbVar1;
                    pbVar17 = pbVar17 + 1) {
                  list = curl_slist_append(list,(pbVar17->_M_dataplus)._M_p);
                }
                curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
                CVar7 = curl_easy_perform(data);
                curl_slist_free_all(list);
                curl_easy_cleanup(data);
                if (local_3f8._M_string_length != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
                  poVar13 = (ostream *)std::ostream::operator<<(local_608,CVar7);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\"",2);
                  pcVar8 = curl_easy_strerror(CVar7);
                  poVar13 = std::operator<<(poVar13,pcVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"",1);
                  pcVar3 = (this->super_cmCommand).Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::AddDefinition(pcVar3,&local_3f8,local_488._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_488._M_dataplus._M_p != &local_488.field_2) {
                    operator_delete(local_488._M_dataplus._M_p,
                                    local_488.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
                  std::ios_base::~ios_base(local_598);
                }
                curl_global_cleanup();
                std::ostream::flush();
                std::ofstream::close();
                if (local_638._M_head_impl != (cmCryptoHash *)0x0) {
                  cmCryptoHash::HashFile(&local_488,local_638._M_head_impl,&local_438);
                  if ((cmFileCommand *)local_488._M_string_length == (cmFileCommand *)0x0) {
                    local_608 = (undefined1  [8])local_5f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_608,"DOWNLOAD cannot compute hash on downloaded file"
                               ,"");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                    if (local_608 != (undefined1  [8])local_5f8) {
                      operator_delete((void *)local_608,
                                      CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                               local_5f8[0]._M_local_buf[0]) + 1);
                    }
LAB_00232a35:
                    bVar5 = false;
                  }
                  else {
                    if ((local_628._M_string_length != local_488._M_string_length) ||
                       (iVar6 = bcmp(local_628._M_dataplus._M_p,local_488._M_dataplus._M_p,
                                     local_488._M_string_length), iVar6 != 0)) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_608,"DOWNLOAD HASH mismatch",0x16);
                      poVar13 = std::endl<char,std::char_traits<char>>((ostream *)local_608);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,"  for file: [",0xd);
                      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar13,local_438._M_dataplus._M_p,
                                           local_438._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"]",1);
                      poVar13 = std::endl<char,std::char_traits<char>>(poVar13);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,"    expected hash: [",0x14);
                      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar13,local_628._M_dataplus._M_p,
                                           local_628._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"]",1);
                      poVar13 = std::endl<char,std::char_traits<char>>(poVar13);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,"      actual hash: [",0x14);
                      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar13,local_488._M_dataplus._M_p,
                                           local_488._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"]",1);
                      poVar13 = std::endl<char,std::char_traits<char>>(poVar13);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,"           status: [",0x14);
                      poVar13 = (ostream *)std::ostream::operator<<(poVar13,CVar7);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar13,";\"",2);
                      pcVar8 = curl_easy_strerror(CVar7);
                      poVar13 = std::operator<<(poVar13,pcVar8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\"]",2);
                      std::endl<char,std::char_traits<char>>(poVar13);
                      if (CVar7 == CURLE_OK && local_3f8._M_string_length != 0) {
                        std::operator+(&local_50,"1;HASH mismatch: expected: ",&local_628);
                        plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
                        psVar16 = (size_type *)(plVar14 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar14 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar16) {
                          local_b0.field_2._M_allocated_capacity = *psVar16;
                          local_b0.field_2._8_8_ = plVar14[3];
                          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                        }
                        else {
                          local_b0.field_2._M_allocated_capacity = *psVar16;
                          local_b0._M_dataplus._M_p = (pointer)*plVar14;
                        }
                        local_b0._M_string_length = plVar14[1];
                        *plVar14 = (long)psVar16;
                        plVar14[1] = 0;
                        *(undefined1 *)(plVar14 + 2) = 0;
                        std::operator+(&local_1b8,&local_b0,&local_488);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                          operator_delete(local_b0._M_dataplus._M_p,
                                          local_b0.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_50._M_dataplus._M_p != &local_50.field_2) {
                          operator_delete(local_50._M_dataplus._M_p,
                                          local_50.field_2._M_allocated_capacity + 1);
                        }
                        cmMakefile::AddDefinition
                                  ((this->super_cmCommand).Makefile,&local_3f8,
                                   local_1b8._M_dataplus._M_p);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                          operator_delete(local_1b8._M_dataplus._M_p,
                                          local_1b8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      std::__cxx11::stringbuf::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_1b8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                        operator_delete(local_1b8._M_dataplus._M_p,
                                        local_1b8.field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
                      std::ios_base::~ios_base(local_598);
                      goto LAB_00232a35;
                    }
                    bVar5 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_488._M_dataplus._M_p != &local_488.field_2) {
                    operator_delete(local_488._M_dataplus._M_p,
                                    local_488.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar5) goto LAB_00232a5c;
                  data = (CURL_conflict *)0x0;
                  goto LAB_00232508;
                }
LAB_00232a5c:
                bVar5 = true;
                if (local_158._M_string_length == 0) {
                  data = (CURL_conflict *)0x0;
                }
                else {
                  local_608 = (undefined1  [8])((ulong)local_608 & 0xffffffffffffff00);
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_1d8,local_608)
                  ;
                  data = (CURL_conflict *)0x0;
                  cmMakefile::AddDefinition
                            ((this->super_cmCommand).Makefile,&local_158,
                             local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
                }
              }
              else {
                CVar7 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
                if (CVar7 == CURLE_OK) {
                  CVar7 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,
                                           anon_unknown.dwarf_7f7ade::cmFileDownloadProgressCallback
                                          );
                  if (CVar7 == CURLE_OK) {
                    CVar7 = curl_easy_setopt(data,CURLOPT_PROGRESSDATA,local_468);
                    if (CVar7 == CURLE_OK) goto LAB_00232484;
                    local_608 = (undefined1  [8])local_5f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_608,"DOWNLOAD cannot set progress data: ","");
                    curl_easy_strerror(CVar7);
                    std::__cxx11::string::append(local_608);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                  }
                  else {
                    local_608 = (undefined1  [8])local_5f8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_608,"DOWNLOAD cannot set progress function: ","");
                    curl_easy_strerror(CVar7);
                    std::__cxx11::string::append(local_608);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                  }
                }
                else {
                  local_608 = (undefined1  [8])local_5f8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_608,"DOWNLOAD cannot set noprogress value: ","");
                  curl_easy_strerror(CVar7);
                  std::__cxx11::string::append(local_608);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
                }
LAB_002324f1:
                if (local_608 != (undefined1  [8])local_5f8) {
                  operator_delete((void *)local_608,
                                  CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                           local_5f8[0]._M_local_buf[0]) + 1);
                }
LAB_00232508:
                bVar5 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_468._16_8_ != &local_448) {
                operator_delete((void *)local_468._16_8_,local_448._M_allocated_capacity + 1);
              }
            }
            else {
              local_608 = (undefined1  [8])local_5f8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_608,"DOWNLOAD cannot set write data: ","");
              curl_easy_strerror(CVar7);
              std::__cxx11::string::append(local_608);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
LAB_002321cf:
              if (local_608 != (undefined1  [8])local_5f8) {
                operator_delete((void *)local_608,
                                CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                         local_5f8[0]._M_local_buf[0]) + 1);
              }
              bVar5 = false;
            }
            if (local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (char *)0x0) {
              operator_delete(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,&local_90);
            bVar5 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,&local_70);
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_608 = (undefined1  [8])local_5f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_608,"DOWNLOAD cannot set url: ","");
        curl_easy_strerror(CVar7);
        std::__cxx11::string::append(local_608);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
LAB_00231bfd:
        if (local_608 != (undefined1  [8])local_5f8) {
          operator_delete((void *)local_608,
                          CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                   local_5f8[0]._M_local_buf[0]) + 1);
        }
        bVar5 = false;
      }
      anon_unknown.dwarf_7f7ade::cURLEasyGuard::~cURLEasyGuard((cURLEasyGuard *)data);
    }
    else {
      local_608 = (undefined1  [8])local_5f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_608,"DOWNLOAD cannot open file for write.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_608);
LAB_002316d3:
      if (local_608 != (undefined1  [8])local_5f8) {
        operator_delete((void *)local_608,
                        CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,
                                 local_5f8[0]._M_local_buf[0]) + 1);
      }
      bVar5 = false;
    }
    local_3d8 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_3d8 + *(long *)(_VTT[-2]._M_local_buf + 8)) = _vtable;
    std::filebuf::~filebuf((filebuf *)&local_3d0);
    std::ios_base::~ios_base(local_2e0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608,
                   "DOWNLOAD error: cannot create directory \'",&local_418);
    plVar14 = (long *)std::__cxx11::string::append(local_608);
    local_3d8 = (undefined1  [8])&local_3c8;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar15) {
      local_3c8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_3c8._8_8_ = plVar14[3];
    }
    else {
      local_3c8._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_3d8 = (undefined1  [8])*plVar14;
    }
    local_3d0 = plVar14[1];
    *plVar14 = (long)paVar15;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    if (local_608 != (undefined1  [8])local_5f8) {
      operator_delete((void *)local_608,
                      CONCAT71(local_5f8[0]._M_allocated_capacity._1_7_,local_5f8[0]._M_local_buf[0]
                              ) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_3d8);
    if (local_3d8 != (undefined1  [8])&local_3c8) {
      operator_delete((void *)local_3d8,local_3c8._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
LAB_00231e1a:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
            ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)&local_638);
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,
                    CONCAT71(local_628.field_2._M_allocated_capacity._1_7_,
                             local_628.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                             local_3f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() < 3) {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
  }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string netrc_level = this->Makefile->GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    this->Makefile->GetSafeDefinition("CMAKE_NETRC_FILE");
  std::string expectedHash;
  std::string hashMatchMSG;
  std::unique_ptr<cmCryptoHash> hash;
  bool showProgress = false;
  std::string userpwd;

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmSystemTools::IsOn(*i);
      } else {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = i->c_str();
      } else {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        this->SetError("DOWNLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        this->SetError("DOWNLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "EXPECTED_MD5") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
      }
      hash = cm::make_unique<cmCryptoHash>(cmCryptoHash::AlgoMD5);
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "EXPECTED_HASH") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
      }
      std::string::size_type pos = i->find("=");
      if (pos == std::string::npos) {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
      }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos + 1));
      hash = std::unique_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if (!hash) {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
      }
      hashMatchMSG = algo + " hash";
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, err);
    }
    ++i;
  }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if (cmSystemTools::FileExists(file) && hash.get()) {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if (actualHash == expectedHash) {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if (!statusVar.empty()) {
        std::ostringstream result;
        result << 0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar, result.str().c_str());
      }
      return true;
    }
  }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if (!cmSystemTools::FileExists(dir) && !cmSystemTools::MakeDirectory(dir)) {
    std::string errstring = "DOWNLOAD error: cannot create directory '" + dir +
      "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
  }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if (!fout) {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
  }

#  if defined(_WIN32)
  url = fix_file_url_windows(url);
#  endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
  }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
  }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    this->SetError(cainfo_err);
    return false;
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    this->SetError(netrc_option_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
  }

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "DOWNLOAD cannot set user password: ");
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << static_cast<int>(res) << ";\"" << ::curl_easy_strerror(res)
           << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash) {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty()) {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
    }

    if (expectedHash != actualHash) {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
          << "  for file: [" << file << "]" << std::endl
          << "    expected hash: [" << expectedHash << "]" << std::endl
          << "      actual hash: [" << actualHash << "]" << std::endl
          << "           status: [" << static_cast<int>(res) << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl;

      if (!statusVar.empty() && res == 0) {
        std::string status = "1;HASH mismatch: "
                             "expected: " +
          expectedHash + " actual: " + actualHash;
        this->Makefile->AddDefinition(statusVar, status.c_str());
      }

      this->SetError(oss.str());
      return false;
    }
  }

  if (!logVar.empty()) {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, chunkDebug.data());
  }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}